

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void api_dynamic_suite::dynamic_size(void)

{
  reference piVar1;
  initializer_list<int> input;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  size_type local_80 [2];
  undefined4 local_6c;
  type local_68 [6];
  circular_view<int,_18446744073709551615UL> local_50;
  
  local_50.member.data = local_68;
  local_68[0] = 0;
  local_68[1] = 0;
  local_68[2] = 0;
  local_68[3] = 0;
  local_50.member.cap = 4;
  local_50.member.size = 0;
  local_50.member.next = 4;
  local_80[0] = 0;
  local_6c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xc6,"void api_dynamic_suite::dynamic_size()",local_80,&local_6c);
  local_80[0] = 0x160000000b;
  local_80[1] = 0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)local_80;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_50,input);
  local_80[0] = local_50.member.size;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,200,"void api_dynamic_suite::dynamic_size()",local_80,&local_6c);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_50,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_50);
  *piVar1 = 0x37;
  local_80[0] = local_50.member.size;
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xca,"void api_dynamic_suite::dynamic_size()",local_80,&local_6c);
  return;
}

Assistant:

void dynamic_size()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span.size(), 4);
    span.push_back(55);
    BOOST_TEST_EQ(span.size(), 4);
}